

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_latlink_t * ps_lattice_reverse_next(ps_lattice_t *dag,ps_latnode_t *start)

{
  undefined8 *local_30;
  latlink_list_t *x;
  ps_latlink_t *next;
  ps_latnode_t *start_local;
  ps_lattice_t *dag_local;
  
  dag_local = (ps_lattice_t *)ps_lattice_popq(dag);
  if (dag_local == (ps_lattice_t *)0x0) {
    dag_local = (ps_lattice_t *)0x0;
  }
  else {
    *(int *)(*(long *)dag_local + 0x20) = *(int *)(*(long *)dag_local + 0x20) + -1;
    if (*(int *)(*(long *)dag_local + 0x20) == 0) {
      next = (ps_latlink_t *)start;
      if (start == (ps_latnode_t *)0x0) {
        next = (ps_latlink_t *)dag->start;
      }
      if (*(ps_latlink_t **)dag_local == next) {
        ps_lattice_delq(dag);
      }
      else {
        for (local_30 = *(undefined8 **)(*(long *)dag_local + 0x30); local_30 != (undefined8 *)0x0;
            local_30 = (undefined8 *)local_30[1]) {
          ps_lattice_pushq(dag,(ps_latlink_t *)*local_30);
        }
      }
    }
  }
  return (ps_latlink_t *)dag_local;
}

Assistant:

ps_latlink_t *
ps_lattice_reverse_next(ps_lattice_t *dag, ps_latnode_t *start)
{
    ps_latlink_t *next;

    next = ps_lattice_popq(dag);
    if (next == NULL)
        return NULL;

    /* Decrease fanout count for source node and expand incoming
     * edges if all incoming edges have been seen. */
    --next->from->info.fanin;
    if (next->from->info.fanin == 0) {
        latlink_list_t *x;

        if (start == NULL) start = dag->start;
        if (next->from == start) {
            /* If we have traversed all links entering the start node,
             * clear the queue, causing future calls to this function
             * to return NULL. */
            ps_lattice_delq(dag);
            return next;
        }

        /* Extend all outgoing edges. */
        for (x = next->from->entries; x; x = x->next)
            ps_lattice_pushq(dag, x->link);
    }
    return next;
}